

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeKernelGetBinaryExp(ze_kernel_handle_t hKernel,size_t *pSize,uint8_t *pKernelBinary)

{
  ze_pfnKernelGetBinaryExp_t pfnGetBinaryExp;
  ze_result_t result;
  uint8_t *pKernelBinary_local;
  size_t *pSize_local;
  ze_kernel_handle_t hKernel_local;
  
  pfnGetBinaryExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c6f8 != (code *)0x0) {
    pfnGetBinaryExp._4_4_ = (*DAT_0011c6f8)(hKernel,pSize,pKernelBinary);
  }
  return pfnGetBinaryExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelGetBinaryExp(
        ze_kernel_handle_t hKernel,                     ///< [in] Kernel handle.
        size_t* pSize,                                  ///< [in,out] pointer to variable with size of GEN ISA binary.
        uint8_t* pKernelBinary                          ///< [in,out] pointer to storage area for GEN ISA binary function.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetBinaryExp = context.zeDdiTable.KernelExp.pfnGetBinaryExp;
        if( nullptr != pfnGetBinaryExp )
        {
            result = pfnGetBinaryExp( hKernel, pSize, pKernelBinary );
        }
        else
        {
            // generic implementation
        }

        return result;
    }